

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::GetTileSize
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 *TileSizeX,Uint32 *TileSizeY
          )

{
  string msg;
  string local_28;
  
  FormatString<char[96]>
            (&local_28,
             (char (*) [96])
             "Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature."
            );
  DebugAssertionFailed
            (local_28._M_dataplus._M_p,"GetTileSize",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
             ,0x131);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

GetTileSize(Uint32& TileSizeX, Uint32& TileSizeY) override
    {
        UNSUPPORTED("Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature.");
    }